

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempLivnessFiller.cpp
# Opt level: O2

int processCodeLine(CodeLine *codeLine)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer ppCVar2;
  CodeLine *pCVar3;
  pointer pCVar4;
  __type _Var5;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  string *psVar8;
  int iVar9;
  pointer ppCVar10;
  _Alloc_hider _Var11;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  CTemp useTemp;
  CTemp outTemp;
  key_type local_b0;
  _Rb_tree_node_base *local_90;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> local_88;
  string local_70;
  string local_50;
  
  (**((codeLine->command).
      super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_AssemblyCommand)(&local_50);
  this = &codeLine->liveInTemps;
  p_Var1 = &(codeLine->liveInTemps)._M_t._M_impl.super__Rb_tree_header;
  iVar9 = 0;
  for (_Var11._M_p = local_50._M_dataplus._M_p; _Var11._M_p != (pointer)local_50._M_string_length;
      _Var11._M_p = _Var11._M_p + 0x20) {
    std::__cxx11::string::string((string *)&local_b0,(string *)_Var11._M_p);
    IRT::CTemp::ToString_abi_cxx11_(&local_70,(CTemp *)&local_b0);
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->_M_t,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
      IRT::CTemp::ToString_abi_cxx11_(&local_70,(CTemp *)&local_b0);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this,&local_70);
      iVar9 = iVar9 + 1;
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector
            ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&local_50);
  for (p_Var7 = (codeLine->liveInTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    std::__cxx11::string::string((string *)&local_b0,(string *)(p_Var7 + 1));
    ppCVar2 = (codeLine->prevLines).
              super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar10 = (codeLine->prevLines).
                    super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppCVar10 != ppCVar2;
        ppCVar10 = ppCVar10 + 1) {
      pCVar3 = *ppCVar10;
      this_00 = &pCVar3->liveOutTemps;
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&this_00->_M_t,&local_b0);
      if ((_Rb_tree_header *)iVar6._M_node ==
          &(pCVar3->liveOutTemps)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_00,&local_b0);
        iVar9 = iVar9 + 1;
      }
    }
    std::__cxx11::string::~string((string *)&local_b0);
  }
  p_Var7 = (codeLine->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90 = &(codeLine->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if (p_Var7 == local_90) {
      return iVar9;
    }
    std::__cxx11::string::string((string *)&local_b0,(string *)(p_Var7 + 1));
    (*((codeLine->command).
       super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_AssemblyCommand[1])(&local_88);
    pCVar4 = local_88.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    psVar8 = (string *)
             local_88.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (psVar8 == (string *)pCVar4) {
        std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_88);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this->_M_t,&local_b0);
        if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this,&local_b0);
          iVar9 = iVar9 + 1;
        }
        goto LAB_001474bf;
      }
      std::__cxx11::string::string((string *)&local_70,psVar8);
      IRT::CTemp::ToString_abi_cxx11_(&local_50,(CTemp *)&local_70);
      _Var5 = std::operator==(&local_50,&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      psVar8 = psVar8 + 0x20;
    } while (!_Var5);
    std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_88);
LAB_001474bf:
    std::__cxx11::string::~string((string *)&local_b0);
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

int processCodeLine(AssemblyCode::CodeLine* codeLine) {
    int changesCount = 0;

    for (auto useTemp : codeLine->command->GetIn()) {
        if (codeLine->liveInTemps.find(useTemp.ToString()) == codeLine->liveInTemps.end()) {
            changesCount += 1;
            codeLine->liveInTemps.insert(useTemp.ToString());
        }
    }

    for (auto liveInTemp : codeLine->liveInTemps) {
        for (auto prevLine : codeLine->prevLines) {
            if (prevLine->liveOutTemps.find(liveInTemp) == prevLine->liveOutTemps.end()) {
                changesCount += 1;
                prevLine->liveOutTemps.insert(liveInTemp);
            }
        }
    }

    for (auto liveOutTemp : codeLine->liveOutTemps) {
        bool found = false;
        for (auto outTemp : codeLine->command->GetOut()) {
            if (outTemp.ToString() == liveOutTemp) {
                found = true;
                break;
            }
        }

        if (!found) {
            if (codeLine->liveInTemps.find(liveOutTemp) == codeLine->liveInTemps.end()) {
                changesCount += 1;
                codeLine->liveInTemps.insert(liveOutTemp);
            }
        }
    }

    return changesCount;
}